

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::MakeCustomLauncher_abi_cxx11_
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,cmCustomCommandGenerator *ccg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  int iVar2;
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  char *pcVar4;
  size_t sVar5;
  undefined4 extraout_var;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string output;
  RuleVariables vars;
  allocator local_179;
  string local_178;
  string local_158;
  string local_138;
  undefined1 local_118 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"RULE_LAUNCH_CUSTOM","");
  __s = cmMakefile::GetProperty(this_00,(string *)local_118);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_118);
    local_158._M_string_length = 0;
    local_158.field_2._M_local_buf[0] = '\0';
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    pvVar3 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_(ccg);
    if ((pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar3->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_assign((string *)&local_158);
      cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_178,ccg);
      paVar1 = &local_178.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar1) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if (local_178._M_string_length == 0) {
        pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
        std::__cxx11::string::string((string *)&local_138,pcVar4,&local_179);
        cmOutputConverter::ConvertToRelativePath
                  (&local_178,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_138,&local_158);
        std::__cxx11::string::operator=((string *)&local_158,(string *)&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != paVar1) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_178,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                  super_cmOutputConverter,&local_158,SHELL);
      std::__cxx11::string::operator=((string *)&local_158,(string *)&local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != paVar1) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
    }
    local_b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_158._M_dataplus._M_p;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar5 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar5);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar2 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])
                      (this);
    local_178._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar2);
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)local_178._M_dataplus._M_p,
               &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               __return_storage_ptr__,(RuleVariables *)local_118);
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::MakeCustomLauncher(
  cmCustomCommandGenerator const& ccg)
{
  const char* property_value =
    this->Makefile->GetProperty("RULE_LAUNCH_CUSTOM");

  if (!property_value || !*property_value) {
    return std::string();
  }

  // Expand rules in the empty string.  It may insert the launcher and
  // perform replacements.
  cmRulePlaceholderExpander::RuleVariables vars;

  std::string output;
  const std::vector<std::string>& outputs = ccg.GetOutputs();
  if (!outputs.empty()) {
    output = outputs[0];
    if (ccg.GetWorkingDirectory().empty()) {
      output =
        this->ConvertToRelativePath(this->GetCurrentBinaryDirectory(), output);
    }
    output = this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
  }
  vars.Output = output.c_str();

  std::string launcher = property_value;
  launcher += " ";

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
  if (!launcher.empty()) {
    launcher += " ";
  }

  return launcher;
}